

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O3

int lws_add_http2_header_by_name(lws *wsi,uchar *name,uchar *value,int length,uchar **p,uchar *end)

{
  uchar *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  byte *pbVar8;
  byte bVar9;
  long lVar10;
  
  uVar5 = (ulong)((int)end - (int)*p);
  uVar7 = (long)(length + 1);
  if (uVar5 < (ulong)(long)(length + 1)) {
    uVar7 = uVar5;
  }
  lws_strncpy((char *)*p,(char *)value,uVar7);
  uVar3 = 0;
  _lws_log(0x40,"%s: %p  %s:%s (len %d)\n","lws_add_http2_header_by_name",*p,name,*p,length);
  sVar6 = strlen((char *)name);
  iVar4 = (int)sVar6;
  if (iVar4 != 0) {
    uVar3 = iVar4 - (uint)(name[iVar4 + -1] == ':');
  }
  if (((wsi->field_0x46e & 2) != 0) &&
     (iVar4 = strncmp((char *)name,"transfer-encoding",(ulong)uVar3), iVar4 == 0)) {
    _lws_log(0x40,"rejecting %s\n",name);
    return 0;
  }
  puVar1 = *p;
  iVar4 = 1;
  if ((long)(int)(length + uVar3 + 8) <= (long)end - (long)puVar1) {
    *p = puVar1 + 1;
    *puVar1 = '\0';
    uVar5 = (ulong)(int)uVar3;
    uVar7 = 0x7f;
    if (uVar5 < 0x7f) {
      uVar7 = uVar5;
    }
    puVar1 = *p;
    *p = puVar1 + 1;
    *puVar1 = (uchar)uVar7;
    if (0x7e < uVar3) {
      pbVar8 = *p;
      uVar7 = uVar5 - 0x7f;
      do {
        bVar9 = (byte)uVar7 | 0x80;
        if (uVar7 < 0x80) {
          bVar9 = (byte)uVar7;
        }
        *p = pbVar8 + 1;
        *pbVar8 = bVar9;
        pbVar8 = *p;
        if (end <= pbVar8) {
          return 1;
        }
        bVar2 = 0x7f < uVar7;
        uVar7 = uVar7 >> 7;
      } while (bVar2);
    }
    if (uVar3 != 0) {
      lVar10 = 0;
      do {
        iVar4 = tolower((uint)name[lVar10]);
        puVar1 = *p;
        *p = puVar1 + 1;
        *puVar1 = (uchar)iVar4;
        lVar10 = lVar10 + 1;
      } while (uVar3 != (uint)lVar10);
    }
    uVar5 = (ulong)length;
    uVar7 = 0x7f;
    if (uVar5 < 0x7f) {
      uVar7 = uVar5;
    }
    puVar1 = *p;
    *p = puVar1 + 1;
    *puVar1 = (uchar)uVar7;
    pbVar8 = *p;
    if (0x7e < (uint)length) {
      uVar7 = uVar5 - 0x7f;
      do {
        bVar9 = (byte)uVar7 | 0x80;
        if (uVar7 < 0x80) {
          bVar9 = (byte)uVar7;
        }
        *p = pbVar8 + 1;
        *pbVar8 = bVar9;
        pbVar8 = *p;
        if (end <= pbVar8) {
          return 1;
        }
        bVar2 = 0x7f < uVar7;
        uVar7 = uVar7 >> 7;
      } while (bVar2);
    }
    memcpy(pbVar8,value,(ulong)(uint)length);
    *p = *p + uVar5;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int lws_add_http2_header_by_name(struct lws *wsi, const unsigned char *name,
				 const unsigned char *value, int length,
				 unsigned char **p, unsigned char *end)
{
	int len;

#if defined(_DEBUG)
	/* value does not have to be NUL-terminated... %.*s not available on
	 * all platforms */
	lws_strnncpy((char *)*p, (const char *)value, length,
			lws_ptr_diff(end, (*p)));

	lwsl_header("%s: %p  %s:%s (len %d)\n", __func__, *p, name,
			(const char *)*p, length);
#endif

	len = (int)strlen((char *)name);
	if (len)
		if (name[len - 1] == ':')
			len--;

	if (wsi->mux_substream && !strncmp((const char *)name,
					     "transfer-encoding", (unsigned int)len)) {
		lwsl_header("rejecting %s\n", name);

		return 0;
	}

	if (end - *p < len + length + 8)
		return 1;

	*((*p)++) = 0; /* literal hdr, literal name,  */

	*((*p)++) = (uint8_t)(0 | (uint8_t)lws_h2_num_start(7, (unsigned long)len)); /* non-HUF */
	if (lws_h2_num(7, (unsigned long)len, p, end))
		return 1;

	/* upper-case header names are verboten in h2, but OK on h1, so
	 * they're not illegal per se.  Silently convert them for h2... */

	while(len--)
		*((*p)++) = (uint8_t)tolower((int)*name++);

	*((*p)++) = (uint8_t)(0 | (uint8_t)lws_h2_num_start(7, (unsigned long)length)); /* non-HUF */
	if (lws_h2_num(7, (unsigned long)length, p, end))
		return 1;

	memcpy(*p, value, (unsigned int)length);
	*p += length;

	return 0;
}